

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureUnitCase::render(TextureUnitCase *this,Context *context)

{
  int iVar1;
  Texture2D *pTVar2;
  TextureCube *pTVar3;
  long lVar4;
  pointer pTVar5;
  uint uVar6;
  deUint32 dVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long local_e0;
  vector<bool,_std::allocator<bool>_> isTextureSetUp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureGLNames;
  Vec3 local_48;
  Vec3 local_3c;
  
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c.m_data._0_8_ = local_3c.m_data._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&isTextureSetUp,(long)this->m_numTextures,(bool *)&local_3c,(allocator_type *)&local_48
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&textureGLNames,(long)this->m_numTextures);
  (*context->_vptr_Context[7])
            (context,(ulong)(uint)this->m_numTextures,
             textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (0 < this->m_numUnits) {
    lVar13 = 0;
    do {
      iVar1 = (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      uVar15 = (ulong)iVar1;
      (*context->_vptr_Context[4])(context,(ulong)((int)lVar13 + 0x84c0));
      (*context->_vptr_Context[6])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar15],
                 (ulong)textureGLNames.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15]);
      uVar11 = uVar15 + 0x3f;
      if (-1 < (long)uVar15) {
        uVar11 = uVar15;
      }
      uVar14 = (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001);
      if ((isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar11 >> 6) + (uVar14 - 1)] >> (uVar15 & 0x3f) & 1) == 0) {
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15],0x2802,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15].wrapModeS);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15],0x2803,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15].wrapModeT);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15],0x2801,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15].minFilter);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15],0x2800,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15].magFilter);
        if ((this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar15] == 0xde1) {
          pTVar2 = (this->m_textures2d).
                   super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15]];
          uVar8 = pTVar2->m_width;
          uVar6 = 1;
          if (((uVar8 & uVar8 - 1) == 0) && (uVar9 = pTVar2->m_height, (uVar9 & uVar9 - 1) == 0)) {
            if ((int)uVar9 < (int)uVar8) {
              uVar9 = uVar8;
            }
            if (uVar9 == 0) {
              uVar6 = 0x20;
            }
            else {
              uVar6 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar6 = uVar6 ^ 0x1f;
            }
            uVar6 = 0x20 - uVar6;
          }
          (*context->_vptr_Context[0xf])(context,0xcf5,1);
          if (uVar6 != 0) {
            lVar12 = 8;
            uVar16 = 0;
            do {
              lVar4 = *(long *)&(pTVar2->super_TextureLevelPyramid).m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data;
              pTVar5 = (this->m_textureParams).
                       super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = (ulong)pTVar5[uVar15].format;
              (*context->_vptr_Context[0x11])
                        (context,0xde1,uVar16 & 0xffffffff,uVar10,(ulong)*(uint *)(lVar4 + lVar12),
                         (ulong)*(uint *)(lVar4 + 4 + lVar12),0,uVar10,
                         (ulong)pTVar5[uVar15].dataType,*(undefined8 *)(lVar4 + 0x18 + lVar12));
              uVar16 = uVar16 + 1;
              lVar12 = lVar12 + 0x28;
            } while (uVar6 != uVar16);
          }
        }
        else {
          pTVar3 = (this->m_texturesCube).
                   super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15]];
          uVar8 = pTVar3->m_size;
          if (uVar8 == 0) {
            uVar6 = 0x20;
          }
          else {
            uVar6 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            uVar6 = uVar6 ^ 0x1f;
          }
          uVar8 = uVar8 - (uVar8 >> 1 & 0x55555555);
          uVar9 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
          uVar8 = 0x20 - uVar6;
          if (1 < ((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
            uVar8 = 1;
          }
          (*context->_vptr_Context[0xf])(context,0xcf5,1);
          local_e0 = 0;
          do {
            if (uVar8 != 0) {
              uVar6 = *(uint *)(s_cubeFaceTargets + local_e0 * 4);
              lVar12 = 8;
              uVar16 = 0;
              do {
                lVar4 = (long)pTVar3->m_access[local_e0].
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                pTVar5 = (this->m_textureParams).
                         super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar10 = (ulong)pTVar5[uVar15].format;
                (*context->_vptr_Context[0x11])
                          (context,(ulong)uVar6,uVar16 & 0xffffffff,uVar10,
                           (ulong)*(uint *)(lVar4 + lVar12),(ulong)*(uint *)(lVar4 + 4 + lVar12),0,
                           uVar10,(ulong)pTVar5[uVar15].dataType,
                           *(undefined8 *)(lVar4 + 0x18 + lVar12));
                uVar16 = uVar16 + 1;
                lVar12 = lVar12 + 0x28;
              } while (uVar8 != uVar16);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != 6);
        }
        isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar11 >> 6) + (uVar14 - 1)] =
             isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar11 >> 6) + (uVar14 - 1)] | 1L << ((byte)iVar1 & 0x3f);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->m_numUnits);
  }
  dVar7 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar7,"Set textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,900);
  dVar7 = (*context->_vptr_Context[0x75])(context,this->m_shader);
  (*context->_vptr_Context[0x2a])(0x3e000000,0x3e800000,0x3f000000,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  MultiTexShader::setUniforms(this->m_shader,context,dVar7);
  local_3c.m_data[0] = -1.0;
  local_3c.m_data[1] = -1.0;
  local_3c.m_data[2] = 0.0;
  local_48.m_data._0_8_ = &DAT_3f8000003f800000;
  local_48.m_data[2] = 0.0;
  sglr::drawQuad(context,dVar7,&local_3c,&local_48);
  dVar7 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar7,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x390);
  (*context->_vptr_Context[8])
            (context,(ulong)(uint)this->m_numTextures,
             textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar7 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar7,"Delete textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x395);
  if (isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)textureGLNames.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)textureGLNames.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureUnitCase::render (sglr::Context& context)
{
	// Setup textures.

	vector<deUint32>	textureGLNames;
	vector<bool>		isTextureSetUp(m_numTextures, false); // \note Same texture may be bound to multiple units, but we only want to set up parameters and data once per texture.

	textureGLNames.resize(m_numTextures);
	context.genTextures(m_numTextures, &textureGLNames[0]);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		int texNdx = m_unitTextures[unitNdx];

		// Bind texture to unit.
		context.activeTexture(GL_TEXTURE0 + unitNdx);
		context.bindTexture(m_textureTypes[texNdx], textureGLNames[texNdx]);

		if (!isTextureSetUp[texNdx])
		{
			// Binding this texture for first time, so set parameters and data.

			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_S, m_textureParams[texNdx].wrapModeS);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_T, m_textureParams[texNdx].wrapModeT);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MIN_FILTER, m_textureParams[texNdx].minFilter);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MAG_FILTER, m_textureParams[texNdx].magFilter);

			if (m_textureTypes[texNdx] == GL_TEXTURE_2D)
			{
				int						ndx2d		= m_ndx2dOrCube[texNdx];
				const tcu::Texture2D*	texture		= m_textures2d[ndx2d];
				bool					mipmaps		= (deIsPowerOfTwo32(texture->getWidth()) && deIsPowerOfTwo32(texture->getHeight()));
				int						numLevels	= mipmaps ? deLog2Floor32(de::max(texture->getWidth(), texture->getHeight()))+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					tcu::ConstPixelBufferAccess		access	= texture->getLevel(levelNdx);
					int								width	= access.getWidth();
					int								height	= access.getHeight();

					DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

					context.texImage2D(GL_TEXTURE_2D, levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
				}
			}
			else
			{
				DE_ASSERT(m_textureTypes[texNdx] == GL_TEXTURE_CUBE_MAP);

				int							ndxCube		= m_ndx2dOrCube[texNdx];
				const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
				bool						mipmaps		= deIsPowerOfTwo32(texture->getSize()) != DE_FALSE;
				int							numLevels	= mipmaps ? deLog2Floor32(texture->getSize())+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
				{
					for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
					{
						tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
						int								width	= access.getWidth();
						int								height	= access.getHeight();

						DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

						context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
					}
				}
			}

			isTextureSetUp[texNdx] = true; // Don't set up this texture's parameters and data again later.
		}
	}

	GLU_EXPECT_NO_ERROR(context.getError(), "Set textures");

	// Setup shader

	deUint32 shaderID = context.createProgram(m_shader);

	// Draw.

	context.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_shader->setUniforms(context, shaderID);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	GLU_EXPECT_NO_ERROR(context.getError(), "Draw");

	// Delete previously generated texture names.

	context.deleteTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Delete textures");
}